

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_SampleBuffers.h
# Opt level: O0

SeparateChannelLayout<float> choc::buffer::SeparateChannelLayout<float>::createAllocated(Size size)

{
  size_t sVar1;
  long lVar2;
  void *pvVar3;
  SeparateChannelLayout<float> SVar4;
  undefined4 local_54;
  ChannelCount i;
  float **list;
  char *allocated;
  unsigned_long listSize;
  size_t dataSize;
  size_t channelDataSize;
  void **allocated_1;
  Size size_local;
  
  allocated_1._0_4_ = size.numChannels;
  if ((uint)allocated_1 == 0) {
    size_local = (Size)operator_new__(8);
    *(Size *)size_local = size_local;
  }
  else {
    allocated_1._4_4_ = size.numFrames;
    sVar1 = getChannelDataSize(allocated_1._4_4_);
    lVar2 = sVar1 * ((ulong)size & 0xffffffff);
    pvVar3 = operator_new__(lVar2 + ((ulong)size & 0xffffffff) * 8);
    size_local = (Size)((long)pvVar3 + lVar2);
    for (local_54 = 0; local_54 < (uint)allocated_1; local_54 = local_54 + 1) {
      *(void **)((long)size_local + (ulong)local_54 * 8) = (void *)((long)pvVar3 + local_54 * sVar1)
      ;
    }
  }
  SVar4._8_8_ = 0;
  SVar4.channels = (float **)size_local;
  return SVar4;
}

Assistant:

static SeparateChannelLayout createAllocated (Size size)
    {
        if (size.numChannels == 0)
        {
            auto allocated = new void*[1];
            *allocated = allocated;
            return { reinterpret_cast<SampleType* const*> (allocated), 0 };
        }

        auto channelDataSize = getChannelDataSize (size.numFrames);
        auto dataSize = channelDataSize * size.numChannels;
        auto listSize = sizeof (SampleType*) * size.numChannels;
        auto allocated = new char[dataSize + listSize];
        auto list = reinterpret_cast<SampleType**> (allocated + dataSize);

        for (decltype (size.numChannels) i = 0; i < size.numChannels; ++i)
            list[i] = reinterpret_cast<SampleType*> (allocated + i * channelDataSize);

        return { list, 0 };
    }